

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O3

void __thiscall cs::statement_try::dump(statement_try *this,ostream *o)

{
  _Elt_pointer ppsVar1;
  ostream *poVar2;
  _Elt_pointer ppsVar3;
  statement_base **ptr;
  _Elt_pointer ppsVar4;
  _Map_pointer pppsVar5;
  
  std::__ostream_insert<char,std::char_traits<char>>(o,"< Try >\n",8);
  ppsVar4 = (this->mTryBody).
            super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  ppsVar1 = (this->mTryBody).
            super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur;
  if (ppsVar4 != ppsVar1) {
    ppsVar3 = (this->mTryBody).
              super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl
              .super__Deque_impl_data._M_start._M_last;
    pppsVar5 = (this->mTryBody).
               super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
               _M_impl.super__Deque_impl_data._M_start._M_node;
    do {
      (*(*ppsVar4)->_vptr_statement_base[5])(*ppsVar4,o);
      ppsVar4 = ppsVar4 + 1;
      if (ppsVar4 == ppsVar3) {
        ppsVar4 = pppsVar5[1];
        pppsVar5 = pppsVar5 + 1;
        ppsVar3 = ppsVar4 + 0x40;
      }
    } while (ppsVar4 != ppsVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(o,"< Catch: ID = \"",0xf);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (o,(this->mName)._M_dataplus._M_p,(this->mName)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\" >\n",4);
  ppsVar4 = (this->mCatchBody).
            super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  ppsVar1 = (this->mCatchBody).
            super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur;
  if (ppsVar4 != ppsVar1) {
    ppsVar3 = (this->mCatchBody).
              super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl
              .super__Deque_impl_data._M_start._M_last;
    pppsVar5 = (this->mCatchBody).
               super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
               _M_impl.super__Deque_impl_data._M_start._M_node;
    do {
      (*(*ppsVar4)->_vptr_statement_base[5])(*ppsVar4,o);
      ppsVar4 = ppsVar4 + 1;
      if (ppsVar4 == ppsVar3) {
        ppsVar4 = pppsVar5[1];
        pppsVar5 = pppsVar5 + 1;
        ppsVar3 = ppsVar4 + 0x40;
      }
    } while (ppsVar4 != ppsVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(o,"< EndTry >\n",0xb);
  return;
}

Assistant:

void statement_try::dump(std::ostream &o) const
	{
		o << "< Try >\n";
		for (auto &ptr: mTryBody)
			ptr->dump(o);
		o << "< Catch: ID = \"" << mName << "\" >\n";
		for (auto &ptr: mCatchBody)
			ptr->dump(o);
		o << "< EndTry >\n";
	}